

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_resize(wchar_t w,wchar_t h)

{
  size_t len;
  int *p;
  int *p_00;
  term_win *ptVar1;
  term_win *f;
  term_win *f_00;
  term_win *ptVar2;
  errr eVar3;
  int *piVar4;
  term_win *ptVar5;
  term_win *ptVar6;
  term *ptVar7;
  ulong uVar8;
  wchar_t h_00;
  wchar_t w_00;
  term_win **pptVar9;
  ui_event local_3c;
  
  local_3c._4_8_ = 0;
  local_3c.type = EVT_RESIZE;
  eVar3 = -1;
  if ((Term->fixed_shape == false) && (L'\0' < h && L'\0' < w)) {
    w_00 = Term->wid;
    h_00 = Term->hgt;
    if (h_00 == h && w_00 == w) {
      eVar3 = 1;
    }
    else {
      if (w <= w_00) {
        w_00 = w;
      }
      if (h <= h_00) {
        h_00 = h;
      }
      p = Term->x1;
      p_00 = Term->x2;
      ptVar1 = Term->old;
      f = Term->scr;
      ptVar6 = Term->mem;
      f_00 = Term->tmp;
      len = (ulong)(uint)h * 4;
      piVar4 = (int *)mem_zalloc(len);
      Term->x1 = piVar4;
      piVar4 = (int *)mem_zalloc(len);
      Term->x2 = piVar4;
      ptVar5 = (term_win *)mem_zalloc(0x60);
      Term->old = ptVar5;
      term_win_init(ptVar5,w,h);
      term_win_copy(Term->old,ptVar1,w_00,h_00);
      ptVar5 = (term_win *)mem_zalloc(0x60);
      Term->scr = ptVar5;
      term_win_init(ptVar5,w,h);
      term_win_copy(Term->scr,f,w_00,h_00);
      pptVar9 = &Term->mem;
      while (ptVar6 != (term_win *)0x0) {
        ptVar5 = (term_win *)mem_zalloc(0x60);
        *pptVar9 = ptVar5;
        term_win_init(ptVar5,w,h);
        term_win_copy(*pptVar9,ptVar6,w_00,h_00);
        ptVar5 = ptVar6->next;
        ptVar2 = *pptVar9;
        if (w <= ptVar2->cx) {
          ptVar2->cu = true;
        }
        if (h <= ptVar2->cy) {
          ptVar2->cu = true;
        }
        pptVar9 = &ptVar2->next;
        term_win_nuke(ptVar6);
        mem_free(ptVar6);
        ptVar6 = ptVar5;
      }
      if (f_00 != (term_win *)0x0) {
        ptVar6 = (term_win *)mem_zalloc(0x60);
        Term->tmp = ptVar6;
        term_win_init(ptVar6,w,h);
        term_win_copy(Term->tmp,f_00,w_00,h_00);
      }
      mem_free(p);
      mem_free(p_00);
      term_win_nuke(ptVar1);
      mem_free(ptVar1);
      ptVar1 = Term->old;
      if (w <= ptVar1->cx) {
        ptVar1->cu = true;
      }
      if (h <= ptVar1->cy) {
        ptVar1->cu = true;
      }
      term_win_nuke(f);
      mem_free(f);
      ptVar7 = Term;
      ptVar1 = Term->scr;
      if (w <= ptVar1->cx) {
        ptVar1->cu = true;
      }
      if (h <= ptVar1->cy) {
        ptVar1->cu = true;
      }
      if (f_00 != (term_win *)0x0) {
        term_win_nuke(f_00);
        mem_free(f_00);
        ptVar7 = Term;
        ptVar1 = Term->tmp;
        if (w <= ptVar1->cx) {
          ptVar1->cu = true;
        }
        if (h <= ptVar1->cy) {
          ptVar1->cu = true;
        }
      }
      ptVar7->wid = w;
      ptVar7->hgt = h;
      ptVar7->total_erase = true;
      for (uVar8 = 0; (uint)h != uVar8; uVar8 = uVar8 + 1) {
        ptVar7->x1[uVar8] = 0;
        ptVar7->x2[uVar8] = w + L'\xffffffff';
      }
      ptVar7->y1 = 0;
      ptVar7->y2 = h + L'\xffffffff';
      Term_event_push(&local_3c);
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

errr Term_resize(int w, int h)
{
	int i;

	int wid, hgt;

	int *hold_x1;
	int *hold_x2;

	term_win *hold_old;
	term_win *hold_scr;
	term_win *hold_mem;
	term_win **hold_mem_dest;
	term_win *hold_tmp;

	ui_event evt = EVENT_EMPTY;
	evt.type = EVT_RESIZE;

	/* Resizing is forbidden */
	if (Term->fixed_shape) return (-1);

	/* Ignore illegal changes */
	if ((w < 1) || (h < 1)) return (-1);

	/* Ignore non-changes */
	if ((Term->wid == w) && (Term->hgt == h)) return (1);

	/* Minimum dimensions */
	wid = MIN(Term->wid, w);
	hgt = MIN(Term->hgt, h);

	/* Save scanners */
	hold_x1 = Term->x1;
	hold_x2 = Term->x2;

	/* Save old window */
	hold_old = Term->old;

	/* Save old window */
	hold_scr = Term->scr;

	/* Save old window */
	hold_mem = Term->mem;

	/* Save old window */
	hold_tmp = Term->tmp;

	/* Create new scanners */
	Term->x1 = mem_zalloc(h * sizeof(int));
	Term->x2 = mem_zalloc(h * sizeof(int));

	/* Create new window */
	Term->old = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->old, w, h);

	/* Save the contents */
	term_win_copy(Term->old, hold_old, wid, hgt);

	/* Create new window */
	Term->scr = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->scr, w, h);

	/* Save the contents */
	term_win_copy(Term->scr, hold_scr, wid, hgt);

	/* If needed */
	hold_mem_dest = &Term->mem;
	while (hold_mem != 0) {
		term_win* trash;

		/* Create new window */
		*hold_mem_dest = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(*hold_mem_dest, w, h);

		/* Save the contents */
		term_win_copy(*hold_mem_dest, hold_mem, wid, hgt);

		trash = hold_mem;
		hold_mem = hold_mem->next;

		if ((*hold_mem_dest)->cx >= w) (*hold_mem_dest)->cu = 1;
		if ((*hold_mem_dest)->cy >= h) (*hold_mem_dest)->cu = 1;

		hold_mem_dest = &((*hold_mem_dest)->next);

		term_win_nuke(trash);
		mem_free(trash);
	}

	/* If needed */
	if (hold_tmp) {
		/* Create new window */
		Term->tmp = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(Term->tmp, w, h);

		/* Save the contents */
		term_win_copy(Term->tmp, hold_tmp, wid, hgt);
	}

	/* Free some arrays */
	mem_free(hold_x1);
	mem_free(hold_x2);

	/* Nuke */
	term_win_nuke(hold_old);

	/* Kill */
	mem_free(hold_old);

	/* Illegal cursor */
	if (Term->old->cx >= w) Term->old->cu = 1;
	if (Term->old->cy >= h) Term->old->cu = 1;

	/* Nuke */
	term_win_nuke(hold_scr);

	/* Kill */
	mem_free(hold_scr);

	/* Illegal cursor */
	if (Term->scr->cx >= w) Term->scr->cu = 1;
	if (Term->scr->cy >= h) Term->scr->cu = 1;

	/* If needed */
	if (hold_tmp) {
		/* Nuke */
		term_win_nuke(hold_tmp);

		/* Kill */
		mem_free(hold_tmp);

		/* Illegal cursor */
		if (Term->tmp->cx >= w) Term->tmp->cu = 1;
		if (Term->tmp->cy >= h) Term->tmp->cu = 1;
	}

	/* Save new size */
	Term->wid = w;
	Term->hgt = h;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Assume change */
	for (i = 0; i < h; i++) {
		/* Assume change */
		Term->x1[i] = 0;
		Term->x2[i] = w - 1;
	}

	/* Assume change */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Push a resize event onto the stack */
	Term_event_push(&evt);

	/* Success */
	return (0);
}